

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void cmovno_(PDISASM pMyDisasm)

{
  REGISTERTYPE *pRVar1;
  Int64 *pIVar2;
  UInt8 UVar3;
  UInt8 UVar4;
  UInt8 UVar5;
  UInt8 UVar6;
  UInt8 UVar7;
  UInt8 UVar8;
  UInt8 UVar9;
  int iVar10;
  uint uVar11;
  
  UVar3 = (pMyDisasm->Reserved_).VEX.state;
  if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
    if (UVar3 == '\x01') {
LAB_00118f78:
      failDecode(pMyDisasm);
      return;
    }
  }
  else if (UVar3 == '\x01') {
    if (((pMyDisasm->Reserved_).VEX.L == '\x01') && (((pMyDisasm->Reserved_).VEX.vvvv & 8) != 0)) {
      iVar10 = Security(2,pMyDisasm);
      if (iVar10 == 0) {
        return;
      }
      uVar11 = (uint)(*(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 6);
      (pMyDisasm->Reserved_).MOD_ = uVar11;
      if (uVar11 == 3) {
        UVar3 = (pMyDisasm->Reserved_).VEX.pp;
        if ((pMyDisasm->Reserved_).REX.W_ == '\0') {
          if (UVar3 == '\0') {
            (pMyDisasm->Instruction).Category = 0x140000;
            builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"kandw",6);
          }
          else {
            if (UVar3 != '\x01') goto LAB_00118f78;
            (pMyDisasm->Instruction).Category = 0x140000;
            builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"kandb",6);
          }
        }
        else if (UVar3 == '\0') {
          (pMyDisasm->Instruction).Category = 0x140000;
          builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"kandq",6);
        }
        else {
          if (UVar3 != '\x01') goto LAB_00118f78;
          (pMyDisasm->Instruction).Category = 0x140000;
          builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"kandd",6);
        }
        (pMyDisasm->Reserved_).Register_ = 0x400;
        GyEy(pMyDisasm);
        return;
      }
    }
    goto LAB_00118f78;
  }
  (pMyDisasm->Instruction).Category = 0x10001;
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"cmovno",7);
  GvEv(pMyDisasm);
  pRVar1 = &(pMyDisasm->Instruction).ImplicitModifiedRegs;
  *(byte *)&pRVar1->type = (byte)pRVar1->type | 0x20;
  pIVar2 = &(pMyDisasm->Instruction).ImplicitModifiedRegs.special;
  *(byte *)pIVar2 = (byte)*pIVar2 | 1;
  UVar3 = EFLAGS_TABLE[0x13].SF_;
  UVar4 = EFLAGS_TABLE[0x13].ZF_;
  UVar5 = EFLAGS_TABLE[0x13].AF_;
  UVar6 = EFLAGS_TABLE[0x13].PF_;
  UVar7 = EFLAGS_TABLE[0x13].CF_;
  UVar8 = EFLAGS_TABLE[0x13].TF_;
  UVar9 = EFLAGS_TABLE[0x13].IF_;
  (pMyDisasm->Instruction).Flags.OF_ = EFLAGS_TABLE[0x13].OF_;
  (pMyDisasm->Instruction).Flags.SF_ = UVar3;
  (pMyDisasm->Instruction).Flags.ZF_ = UVar4;
  (pMyDisasm->Instruction).Flags.AF_ = UVar5;
  (pMyDisasm->Instruction).Flags.PF_ = UVar6;
  (pMyDisasm->Instruction).Flags.CF_ = UVar7;
  (pMyDisasm->Instruction).Flags.TF_ = UVar8;
  (pMyDisasm->Instruction).Flags.IF_ = UVar9;
  UVar3 = EFLAGS_TABLE[0x13].NT_;
  UVar4 = EFLAGS_TABLE[0x13].RF_;
  UVar5 = EFLAGS_TABLE[0x13].alignment;
  (pMyDisasm->Instruction).Flags.DF_ = EFLAGS_TABLE[0x13].DF_;
  (pMyDisasm->Instruction).Flags.NT_ = UVar3;
  (pMyDisasm->Instruction).Flags.RF_ = UVar4;
  (pMyDisasm->Instruction).Flags.alignment = UVar5;
  return;
}

Assistant:

void __bea_callspec__ cmovno_(PDISASM pMyDisasm)
{

  if (
      (GV.EVEX.state != InUsePrefix) &&
      (GV.VEX.state == InUsePrefix) &&
      (GV.VEX.L == 1) &&
      (((GV.VEX.vvvv >> 3) & 0x1) == 1)
    ) {
    if (!Security(2, pMyDisasm)) return;
    GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
    if (GV.MOD_ == 0x3) {
      if (GV.REX.W_ == 0) {
        if (GV.VEX.pp == 1) {
          pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "kandb");
          #endif
          GV.Register_ = OPMASK_REG;
          GyEy(pMyDisasm);
        }
        else if (GV.VEX.pp == 0) {
          pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "kandw");
          #endif
          GV.Register_ = OPMASK_REG;
          GyEy(pMyDisasm);
        }
        else {
          failDecode(pMyDisasm);
        }
      }
      else {
        if (GV.VEX.pp == 1) {
          pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "kandd");
          #endif
          GV.Register_ = OPMASK_REG;
          GyEy(pMyDisasm);
        }
        else if (GV.VEX.pp == 0) {
          pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "kandq");
          #endif
          GV.Register_ = OPMASK_REG;
          GyEy(pMyDisasm);
        }
        else {
          failDecode(pMyDisasm);
        }
      }
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else if (GV.VEX.state != InUsePrefix){
    pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+DATA_TRANSFER;
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) strcpy (pMyDisasm->Instruction.Mnemonic, "cmovno");
    #endif
    GvEv(pMyDisasm);
    FillFlags(pMyDisasm, 19);
  }
  else {
    failDecode(pMyDisasm);
  }
}